

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextodfwriter.cpp
# Opt level: O2

void __thiscall
QZipStreamStrategy::addFile(QZipStreamStrategy *this,QString *fileName,QString *mimeType)

{
  QXmlStreamWriter *pQVar1;
  char16_t *pcVar2;
  ulong uVar3;
  storage_type *psVar4;
  size_t in_R9;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  QAnyStringView QVar6;
  QByteArrayView QVar7;
  QAnyStringView QVar8;
  QByteArrayView QVar9;
  QAnyStringView QVar10;
  QAnyStringView QVar11;
  QAnyStringView QVar12;
  QAnyStringView QVar13;
  QAnyStringView QVar14;
  QAnyStringView QVar15;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = &this->manifestWriter;
  pcVar2 = (this->manifestNS).d.ptr;
  uVar3 = (this->manifestNS).d.size;
  psVar4 = (storage_type *)QByteArrayView::lengthHelperCharArray("file-entry",0xb);
  QVar5.m_data = psVar4;
  QVar5.m_size = (qsizetype)&local_50;
  QString::fromLatin1(QVar5);
  QVar6.m_size = (size_t)pcVar2;
  QVar6.field_0.m_data = pQVar1;
  QVar11.m_size = (size_t)local_50.ptr;
  QVar11.field_0.m_data = (void *)(uVar3 | 0x8000000000000000);
  QXmlStreamWriter::writeEmptyElement(QVar6,QVar11);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  pcVar2 = (this->manifestNS).d.ptr;
  uVar3 = (this->manifestNS).d.size;
  psVar4 = (storage_type *)QByteArrayView::lengthHelperCharArray("media-type",0xb);
  QVar7.m_data = psVar4;
  QVar7.m_size = (qsizetype)&local_50;
  QString::fromLatin1(QVar7);
  QVar14.field_0.m_data = (void *)(local_50.size | 0x8000000000000000);
  QVar8.m_size = (size_t)pcVar2;
  QVar8.field_0.m_data = pQVar1;
  QVar12.m_size = (size_t)local_50.ptr;
  QVar12.field_0.m_data = (void *)(uVar3 | 0x8000000000000000);
  QVar14.m_size = in_R9;
  QXmlStreamWriter::writeAttribute(QVar8,QVar12,QVar14);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  pcVar2 = (this->manifestNS).d.ptr;
  uVar3 = (this->manifestNS).d.size;
  psVar4 = (storage_type *)QByteArrayView::lengthHelperCharArray("full-path",10);
  QVar9.m_data = psVar4;
  QVar9.m_size = (qsizetype)&local_50;
  QString::fromLatin1(QVar9);
  QVar15.field_0.m_data = (void *)(local_50.size | 0x8000000000000000);
  QVar10.m_size = (size_t)pcVar2;
  QVar10.field_0.m_data = pQVar1;
  QVar13.m_size = (size_t)local_50.ptr;
  QVar13.field_0.m_data = (void *)(uVar3 | 0x8000000000000000);
  QVar15.m_size = in_R9;
  QXmlStreamWriter::writeAttribute(QVar10,QVar13,QVar15);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void addFile(const QString &fileName, const QString &mimeType)
    {
        manifestWriter.writeEmptyElement(manifestNS, QString::fromLatin1("file-entry"));
        manifestWriter.writeAttribute(manifestNS, QString::fromLatin1("media-type"), mimeType);
        manifestWriter.writeAttribute(manifestNS, QString::fromLatin1("full-path"), fileName);
    }